

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

bool crnlib::string_to_float(char **p,float *value,uint round_digit)

{
  bool bVar1;
  undefined4 in_EDX;
  float *in_RSI;
  double d;
  double *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar1 = string_to_double((char **)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffd8,0);
  if (bVar1) {
    *in_RSI = (float)(double)in_stack_ffffffffffffffd8;
  }
  else {
    *in_RSI = 0.0;
  }
  return bVar1;
}

Assistant:

bool string_to_float(const char*& p, float& value, uint round_digit) {
  double d;
  if (!string_to_double(p, d, round_digit)) {
    value = 0;
    return false;
  }
  value = static_cast<float>(d);
  return true;
}